

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O2

Matrix * __thiscall LUPMatrix::GetMatrix(Matrix *__return_storage_ptr__,LUPMatrix *this)

{
  _Vector_base<int,_std::allocator<int>_> local_70;
  Matrix local_58;
  Matrix local_38;
  
  Permutation::GetInverse((Permutation *)&local_70,&this->row_permutation_);
  operator*(&local_58,(Permutation *)&local_70,&this->l_);
  operator*(&local_38,&local_58,&this->u_);
  operator*(__return_storage_ptr__,&local_38,&this->column_permutation_);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_38.elements_);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_58.elements_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Matrix LUPMatrix::GetMatrix() const {
  return row_permutation_.GetInverse() * l_ * u_ * column_permutation_;
}